

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenParam
          (CppGenerator *this,FieldDef *field,bool direct,char *prefix)

{
  char *__s;
  bool bVar1;
  allocator<char> local_459;
  string local_458;
  string local_438;
  allocator<char> local_411;
  string local_410;
  string local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  string local_388;
  allocator<char> local_361;
  string local_360;
  Type *local_340;
  Type *type_1;
  string local_330;
  allocator<char> local_309;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  allocator<char> local_239;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  string type;
  Type vtype;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *prefix_local;
  FieldDef *pFStack_18;
  bool direct_local;
  FieldDef *field_local;
  CppGenerator *this_local;
  
  local_28 = prefix;
  prefix_local._7_1_ = direct;
  pFStack_18 = field;
  field_local = (FieldDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"PRE",&local_49);
  __s = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_81);
  CodeWriter::SetValue(&this->code_,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"PARAM_NAME",&local_a9);
  Name_abi_cxx11_(&local_d0,this,pFStack_18);
  CodeWriter::SetValue(&this->code_,&local_a8,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  if (((prefix_local._7_1_ & 1) == 0) || (bVar1 = IsString(&(pFStack_18->value).type), !bVar1)) {
    if (((prefix_local._7_1_ & 1) == 0) || (bVar1 = IsVector(&(pFStack_18->value).type), !bVar1)) {
      local_340 = &(pFStack_18->value).type;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,"PARAM_VALUE",&local_361);
      GetDefaultScalarValue_abi_cxx11_(&local_388,this,pFStack_18,false);
      CodeWriter::SetValue(&this->code_,&local_360,&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_360);
      std::allocator<char>::~allocator(&local_361);
      bVar1 = FieldDef::IsScalarOptional(pFStack_18);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"PARAM_TYPE",&local_3a9);
        GenOptionalDecl_abi_cxx11_(&local_3f0,this,local_340);
        std::operator+(&local_3d0,&local_3f0," ");
        CodeWriter::SetValue(&this->code_,&local_3a8,&local_3d0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::allocator<char>::~allocator(&local_3a9);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_410,"PARAM_TYPE",&local_411);
        GenTypeWire_abi_cxx11_(&local_438,this,local_340," ",true,(bool)(pFStack_18->offset64 & 1));
        CodeWriter::SetValue(&this->code_,&local_410,&local_438);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_410);
        std::allocator<char>::~allocator(&local_411);
      }
    }
    else {
      Type::VectorType((Type *)((long)&type.field_2 + 8),&(pFStack_18->value).type);
      std::__cxx11::string::string((string *)local_1b0);
      bVar1 = IsStruct((Type *)((long)&type.field_2 + 8));
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"",&local_1f1);
        BaseGenerator::WrapInNameSpace
                  (&local_1d0,&this->super_BaseGenerator,(Definition *)vtype._0_8_,&local_1f0);
        std::__cxx11::string::operator=((string *)local_1b0,(string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::allocator<char>::~allocator(&local_1f1);
      }
      else {
        bVar1 = VectorElementUserFacing(this,(Type *)((long)&type.field_2 + 8));
        GenTypeWire_abi_cxx11_
                  (&local_218,this,(Type *)((long)&type.field_2 + 8),"",bVar1,
                   (bool)(pFStack_18->offset64 & 1));
        std::__cxx11::string::operator=((string *)local_1b0,(string *)&local_218);
        std::__cxx11::string::~string((string *)&local_218);
      }
      bVar1 = TypeHasKey(this,(Type *)((long)&type.field_2 + 8));
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"PARAM_TYPE",&local_239);
        std::operator+(&local_280,"std::vector<",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0);
        std::operator+(&local_260,&local_280,"> *");
        CodeWriter::SetValue(&this->code_,&local_238,&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)&local_238);
        std::allocator<char>::~allocator(&local_239);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0,"PARAM_TYPE",&local_2a1);
        std::operator+(&local_2e8,"const std::vector<",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0);
        std::operator+(&local_2c8,&local_2e8,"> *");
        CodeWriter::SetValue(&this->code_,&local_2a0,&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::allocator<char>::~allocator(&local_2a1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,"PARAM_VALUE",&local_309);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"nullptr",(allocator<char> *)((long)&type_1 + 7));
      CodeWriter::SetValue(&this->code_,&local_308,&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::allocator<char>::~allocator((allocator<char> *)((long)&type_1 + 7));
      std::__cxx11::string::~string((string *)&local_308);
      std::allocator<char>::~allocator(&local_309);
      std::__cxx11::string::~string((string *)local_1b0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"PARAM_TYPE",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"const char *",&local_119);
    CodeWriter::SetValue(&this->code_,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"PARAM_VALUE",&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"nullptr",(allocator<char> *)&vtype.field_0x1f);
    CodeWriter::SetValue(&this->code_,&local_140,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&vtype.field_0x1f);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"{{PRE}}{{PARAM_TYPE}}{{PARAM_NAME}} = {{PARAM_VALUE}}\\",
             &local_459);
  CodeWriter::operator+=(&this->code_,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  return;
}

Assistant:

void GenParam(const FieldDef &field, bool direct, const char *prefix) {
    code_.SetValue("PRE", prefix);
    code_.SetValue("PARAM_NAME", Name(field));
    if (direct && IsString(field.value.type)) {
      code_.SetValue("PARAM_TYPE", "const char *");
      code_.SetValue("PARAM_VALUE", "nullptr");
    } else if (direct && IsVector(field.value.type)) {
      const auto vtype = field.value.type.VectorType();
      std::string type;
      if (IsStruct(vtype)) {
        type = WrapInNameSpace(*vtype.struct_def);
      } else {
        type = GenTypeWire(vtype, "", VectorElementUserFacing(vtype),
                           field.offset64);
      }
      if (TypeHasKey(vtype)) {
        code_.SetValue("PARAM_TYPE", "std::vector<" + type + "> *");
      } else {
        code_.SetValue("PARAM_TYPE", "const std::vector<" + type + "> *");
      }
      code_.SetValue("PARAM_VALUE", "nullptr");
    } else {
      const auto &type = field.value.type;
      code_.SetValue("PARAM_VALUE", GetDefaultScalarValue(field, false));
      if (field.IsScalarOptional())
        code_.SetValue("PARAM_TYPE", GenOptionalDecl(type) + " ");
      else
        code_.SetValue("PARAM_TYPE",
                       GenTypeWire(type, " ", true, field.offset64));
    }
    code_ += "{{PRE}}{{PARAM_TYPE}}{{PARAM_NAME}} = {{PARAM_VALUE}}\\";
  }